

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_impl.h
# Opt level: O3

void run_ellswift_bench(int iters,int argc,char **argv)

{
  int iVar1;
  long lVar2;
  long lVar3;
  int in_R9D;
  long lVar4;
  bench_ellswift_data data;
  int in_stack_ffffffffffffbf78;
  undefined8 local_4078 [2057];
  
  local_4078[0] = secp256k1_context_create(1);
  lVar4 = (long)argc;
  if (argc != 1) {
    lVar3 = lVar4 * 8;
    lVar2 = 8;
    do {
      if (lVar3 - lVar2 == 0) {
        lVar2 = 8;
        goto LAB_00102908;
      }
      iVar1 = strcmp(*(char **)((long)argv + lVar2),"ellswift");
      lVar2 = lVar2 + 8;
    } while (iVar1 != 0);
  }
  goto LAB_00102948;
  while( true ) {
    iVar1 = strcmp(*(char **)((long)argv + lVar2),"encode");
    lVar2 = lVar2 + 8;
    if (iVar1 == 0) break;
LAB_00102908:
    if (lVar3 - lVar2 == 0) {
      lVar2 = 8;
      goto LAB_0010292f;
    }
  }
  goto LAB_00102948;
  while( true ) {
    iVar1 = strcmp(*(char **)((long)argv + lVar2),"decode");
    lVar2 = lVar2 + 8;
    if (iVar1 == 0) break;
LAB_001029ac:
    if (lVar3 - lVar2 == 0) {
      lVar2 = 8;
      goto LAB_001029d3;
    }
  }
  goto LAB_001029ec;
  while( true ) {
    iVar1 = strcmp(*(char **)((long)argv + lVar2),"ellswift_decode");
    lVar2 = lVar2 + 8;
    if (iVar1 == 0) break;
LAB_001029d3:
    if (lVar3 - lVar2 == 0) goto LAB_00102a10;
  }
  goto LAB_001029ec;
  while( true ) {
    iVar1 = strcmp(*(char **)((long)argv + lVar2),"keygen");
    lVar2 = lVar2 + 8;
    if (iVar1 == 0) break;
LAB_00102a50:
    if (lVar3 - lVar2 == 0) {
      lVar2 = 8;
      goto LAB_00102a77;
    }
  }
  goto LAB_00102a90;
  while( true ) {
    iVar1 = strcmp(*(char **)((long)argv + lVar2),"ellswift_keygen");
    lVar2 = lVar2 + 8;
    if (iVar1 == 0) break;
LAB_00102a77:
    if (lVar3 - lVar2 == 0) goto LAB_00102ab4;
  }
  goto LAB_00102a90;
  while( true ) {
    iVar1 = strcmp(*(char **)((long)argv + lVar3),"ecdh");
    lVar3 = lVar3 + 8;
    if (iVar1 == 0) break;
LAB_00102af0:
    if (lVar4 == lVar3) {
      lVar3 = 8;
      goto LAB_00102b17;
    }
  }
  goto LAB_00102b30;
  while( true ) {
    iVar1 = strcmp(*(char **)((long)argv + lVar3),"ellswift_ecdh");
    lVar3 = lVar3 + 8;
    if (iVar1 == 0) break;
LAB_00102b17:
    if (lVar4 == lVar3) goto LAB_00102b54;
  }
  goto LAB_00102b30;
  while( true ) {
    iVar1 = strcmp(*(char **)((long)argv + lVar2),"ellswift_encode");
    lVar2 = lVar2 + 8;
    if (iVar1 == 0) break;
LAB_0010292f:
    if (lVar3 - lVar2 == 0) goto LAB_0010296c;
  }
LAB_00102948:
  run_benchmark("ellswift_encode",bench_ellswift_encode,bench_ellswift_setup,
                (_func_void_void_ptr_int *)local_4078,(void *)(ulong)(uint)iters,in_R9D,
                in_stack_ffffffffffffbf78);
LAB_0010296c:
  if (argc != 1) {
    lVar3 = lVar4 * 8;
    lVar2 = 8;
    do {
      if (lVar3 - lVar2 == 0) {
        lVar2 = 8;
        goto LAB_001029ac;
      }
      iVar1 = strcmp(*(char **)((long)argv + lVar2),"ellswift");
      lVar2 = lVar2 + 8;
    } while (iVar1 != 0);
  }
LAB_001029ec:
  run_benchmark("ellswift_decode",bench_ellswift_decode,bench_ellswift_setup,
                (_func_void_void_ptr_int *)local_4078,(void *)(ulong)(uint)iters,in_R9D,
                in_stack_ffffffffffffbf78);
LAB_00102a10:
  if (argc != 1) {
    lVar3 = lVar4 * 8;
    lVar2 = 8;
    do {
      if (lVar3 - lVar2 == 0) {
        lVar2 = 8;
        goto LAB_00102a50;
      }
      iVar1 = strcmp(*(char **)((long)argv + lVar2),"ellswift");
      lVar2 = lVar2 + 8;
    } while (iVar1 != 0);
  }
LAB_00102a90:
  run_benchmark("ellswift_keygen",bench_ellswift_create,bench_ellswift_setup,
                (_func_void_void_ptr_int *)local_4078,(void *)(ulong)(uint)iters,in_R9D,
                in_stack_ffffffffffffbf78);
LAB_00102ab4:
  if (argc != 1) {
    lVar4 = lVar4 * 8;
    lVar3 = 8;
    do {
      if (lVar4 == lVar3) {
        lVar3 = 8;
        goto LAB_00102af0;
      }
      iVar1 = strcmp(*(char **)((long)argv + lVar3),"ellswift");
      lVar3 = lVar3 + 8;
    } while (iVar1 != 0);
  }
LAB_00102b30:
  run_benchmark("ellswift_ecdh",bench_ellswift_xdh,bench_ellswift_setup,
                (_func_void_void_ptr_int *)local_4078,(void *)(ulong)(uint)iters,in_R9D,
                in_stack_ffffffffffffbf78);
LAB_00102b54:
  secp256k1_context_destroy(local_4078[0]);
  return;
}

Assistant:

void run_ellswift_bench(int iters, int argc, char **argv) {
    bench_ellswift_data data;
    int d = argc == 1;

    /* create a context with signing capabilities */
    data.ctx = secp256k1_context_create(SECP256K1_CONTEXT_NONE);

    if (d || have_flag(argc, argv, "ellswift") || have_flag(argc, argv, "encode") || have_flag(argc, argv, "ellswift_encode")) run_benchmark("ellswift_encode", bench_ellswift_encode, bench_ellswift_setup, NULL, &data, 10, iters);
    if (d || have_flag(argc, argv, "ellswift") || have_flag(argc, argv, "decode") || have_flag(argc, argv, "ellswift_decode")) run_benchmark("ellswift_decode", bench_ellswift_decode, bench_ellswift_setup, NULL, &data, 10, iters);
    if (d || have_flag(argc, argv, "ellswift") || have_flag(argc, argv, "keygen") || have_flag(argc, argv, "ellswift_keygen")) run_benchmark("ellswift_keygen", bench_ellswift_create, bench_ellswift_setup, NULL, &data, 10, iters);
    if (d || have_flag(argc, argv, "ellswift") || have_flag(argc, argv, "ecdh") || have_flag(argc, argv, "ellswift_ecdh")) run_benchmark("ellswift_ecdh", bench_ellswift_xdh, bench_ellswift_setup, NULL, &data, 10, iters);

    secp256k1_context_destroy(data.ctx);
}